

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcGrid::IfcGrid(IfcGrid *this)

{
  IfcGrid *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x160,"IfcGrid");
  IfcProduct::IfcProduct(&this->super_IfcProduct,&PTR_construction_vtable_24__00feb240);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcGrid,_3UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcGrid,_3UL> *)
             &(this->super_IfcProduct).field_0x100,&PTR_construction_vtable_24__00feb2f0);
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0xfeb160;
  *(undefined8 *)&this->field_0x160 = 0xfeb228;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0xfeb188;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xfeb1b0;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = 0xfeb1d8;
  *(undefined8 *)&(this->super_IfcProduct).field_0x100 = 0xfeb200;
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_1UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_1UL,_0UL> *)
             &(this->super_IfcProduct).field_0x110);
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_1UL,_0UL>::ListOf
            (&this->VAxes);
  STEP::
  Maybe<Assimp::STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_1UL,_0UL>_>
  ::Maybe(&this->WAxes);
  return;
}

Assistant:

IfcGrid() : Object("IfcGrid") {}